

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void RunBench(Benchmark *b,int nthread,int siz)

{
  int iVar1;
  char *__format;
  long lVar2;
  int iVar3;
  int n;
  undefined1 auVar4 [16];
  char suf [100];
  char mb [100];
  
  if (nthread == 1) {
    n = 1;
    while( true ) {
      runN(b,n,siz);
      lVar2 = (long)n;
      if ((999999999 < n) || (999999999 < ns)) break;
      if (ns / lVar2 == 0) {
        iVar1 = 1000000000;
      }
      else {
        iVar1 = (int)(1000000000 / (long)(int)(ns / lVar2));
      }
      iVar1 = iVar1 / 2 + iVar1;
      if (n * 100 < iVar1) {
        iVar1 = n * 100;
      }
      if (iVar1 < n + 1) {
        iVar1 = n + 1;
      }
      n = 1;
      do {
        iVar3 = n;
        n = iVar3 * 10;
      } while (n < iVar1);
      if (iVar1 < iVar3 * 5) {
        n = iVar3 * 5;
      }
      if (iVar1 < iVar3 * 2) {
        n = iVar3 * 2;
      }
    }
    mb[0] = '\0';
    suf[0] = '\0';
    if (0 < bytes && 0 < ns) {
      auVar4._0_8_ = ((double)((ulong)bytes >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25)
                     + (double)(bytes & 0xffffffffU | 0x4330000000000000);
      auVar4._8_8_ = ((double)((ulong)ns >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                     (double)(ns & 0xffffffffU | 0x4330000000000000);
      auVar4 = divpd(auVar4,_DAT_00148d00);
      snprintf(mb,100,"\t%7.2f MB/s",auVar4._0_8_ / auVar4._8_8_);
    }
    if ((b->fnr != (_func_void_int_int *)0x0) || (b->lo != b->hi)) {
      if (siz < 0x100000) {
        if (siz < 0x400) {
          __format = "/%d";
        }
        else {
          siz = (uint)siz >> 10;
          __format = "/%dK";
        }
      }
      else {
        siz = (uint)siz >> 0x14;
        __format = "/%dM";
      }
      snprintf(suf,100,__format,(ulong)(uint)siz);
    }
    printf("%s%s\t%8lld\t%10lld ns/op%s\n",b->name,suf,lVar2,ns / lVar2,mb);
    fflush(_stdout);
  }
  return;
}

Assistant:

void RunBench(Benchmark* b, int nthread, int siz) {
	int n, last;

	// TODO(rsc): Threaded benchmarks.
	if(nthread != 1)
		return;
	
	// run once in case it's expensive
	n = 1;
	runN(b, n, siz);
	while(ns < (int)1e9 && n < (int)1e9) {
		last = n;
		if(ns/n == 0)
			n = (int)1e9;
		else
			n = (int)1e9 / static_cast<int>(ns/n);
		
		n = max(last+1, min(n+n/2, 100*last));
		n = round(n);
		runN(b, n, siz);
	}
	
	char mb[100];
	char suf[100];
	mb[0] = '\0';
	suf[0] = '\0';
	if(ns > 0 && bytes > 0)
		snprintf(mb, sizeof mb, "\t%7.2f MB/s", ((double)bytes/1e6)/((double)ns/1e9));
	if(b->fnr || b->lo != b->hi) {
		if(siz >= (1<<20))
			snprintf(suf, sizeof suf, "/%dM", siz/(1<<20));
		else if(siz >= (1<<10))
			snprintf(suf, sizeof suf, "/%dK", siz/(1<<10));
		else
			snprintf(suf, sizeof suf, "/%d", siz);
	}
	printf("%s%s\t%8lld\t%10lld ns/op%s\n", b->name, suf, (long long)n, (long long)ns/n, mb);
	fflush(stdout);
}